

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void self_destruct(j_common_ptr cinfo)

{
  j_common_ptr in_RDI;
  int pool;
  int in_stack_0000002c;
  j_common_ptr in_stack_00000030;
  void *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 1; -1 < iVar1; iVar1 = iVar1 + -1) {
    free_pool(in_stack_00000030,in_stack_0000002c);
  }
  jpeg_free_small((j_common_ptr)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
                  0x17437b);
  in_RDI->mem = (jpeg_memory_mgr *)0x0;
  jpeg_mem_term(in_RDI);
  return;
}

Assistant:

METHODDEF(void)
self_destruct(j_common_ptr cinfo)
{
  int pool;

  /* Close all backing store, release all memory.
   * Releasing pools in reverse order might help avoid fragmentation
   * with some (brain-damaged) malloc libraries.
   */
  for (pool = JPOOL_NUMPOOLS - 1; pool >= JPOOL_PERMANENT; pool--) {
    free_pool(cinfo, pool);
  }

  /* Release the memory manager control block too. */
  jpeg_free_small(cinfo, (void *)cinfo->mem, sizeof(my_memory_mgr));
  cinfo->mem = NULL;            /* ensures I will be called only once */

  jpeg_mem_term(cinfo);         /* system-dependent cleanup */
}